

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_isResolvedUnitsNotImportPartiallyDefined_Test::
~Importer_isResolvedUnitsNotImportPartiallyDefined_Test
          (Importer_isResolvedUnitsNotImportPartiallyDefined_Test *this)

{
  Importer_isResolvedUnitsNotImportPartiallyDefined_Test *this_local;
  
  ~Importer_isResolvedUnitsNotImportPartiallyDefined_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, isResolvedUnitsNotImportPartiallyDefined)
{
    auto model = libcellml::Model::create("standard_model");
    auto units = libcellml::Units::create("my_units");
    units->addUnit("seconds", -1.0);

    model->addUnits(units);

    EXPECT_FALSE(model->hasUnresolvedImports());
    EXPECT_TRUE(units->isResolved());
    EXPECT_FALSE(units->isDefined());
}